

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regparse.c
# Opt level: O0

Node * node_new_ctype(int type,int not,OnigOptionType options)

{
  bool local_2b;
  bool local_2a;
  bool local_29;
  Node *node;
  OnigOptionType options_local;
  int not_local;
  int type_local;
  
  _not_local = node_new();
  if (_not_local == (Node *)0x0) {
    _not_local = (Node *)0x0;
  }
  else {
    (_not_local->u).base.node_type = ND_CTYPE;
    (_not_local->u).backref.back_num = type;
    (_not_local->u).backref.back_static[0] = not;
    local_29 = false;
    if (-1 < type) {
      if ((((0xd < type) || (local_2a = true, (options & 0x80000) == 0)) &&
          ((type != 0xc || (local_2a = true, (options & 0x90000) == 0)))) &&
         ((type != 4 || (local_2a = true, (options & 0xa0000) == 0)))) {
        local_2b = type == 9 && (options & 0xc0000) != 0;
        local_2a = local_2b;
      }
      local_29 = local_2a;
    }
    *(uint *)((long)&_not_local->u + 0x18) = (uint)local_29;
  }
  return _not_local;
}

Assistant:

static Node*
node_new_ctype(int type, int not, OnigOptionType options)
{
  Node* node = node_new();
  CHECK_NULL_RETURN(node);

  ND_SET_TYPE(node, ND_CTYPE);
  CTYPE_(node)->ctype   = type;
  CTYPE_(node)->not     = not;
  CTYPE_(node)->ascii_mode = OPTON_IS_ASCII_MODE_CTYPE(type, options);
  return node;
}